

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::destroy_thread_for_agent
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  work_thread_shptr_t thread;
  undefined1 local_18 [16];
  
  search_and_remove_agent_from_map
            ((dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
              *)local_18,(agent_t *)this);
  if ((work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t> *)
      local_18._0_8_ !=
      (work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t> *)
      0x0) {
    (anonymous_namespace)::
    shutdown_and_wait<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>
              ((work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
                *)local_18._0_8_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  return;
}

Assistant:

void
		destroy_thread_for_agent( const agent_t & agent ) override
			{
				auto thread = search_and_remove_agent_from_map( agent );
				if( thread )
					shutdown_and_wait( *thread );
			}